

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall Builder::StartEdge(Builder *this,Edge *edge,string *err)

{
  BindingEnv *this_00;
  CommandRunner *pCVar1;
  Metrics *this_01;
  bool bVar2;
  int iVar3;
  Metric *pMVar4;
  bool bVar5;
  pointer ppNVar6;
  string rspfile;
  string content;
  ScopedMetric metrics_h_scoped;
  string sStack_d8;
  string local_b8;
  string local_98;
  ScopedMetric local_78;
  string local_68;
  string local_48;
  
  if (StartEdge(Edge*,std::__cxx11::string*)::metrics_h_metric == '\0') {
    iVar3 = __cxa_guard_acquire(&StartEdge(Edge*,std::__cxx11::string*)::metrics_h_metric);
    this_01 = g_metrics;
    if (iVar3 != 0) {
      if (g_metrics == (Metrics *)0x0) {
        pMVar4 = (Metric *)0x0;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sStack_d8,"StartEdge",(allocator<char> *)&local_b8);
        pMVar4 = Metrics::NewMetric(this_01,&sStack_d8);
        std::__cxx11::string::~string((string *)&sStack_d8);
      }
      StartEdge::metrics_h_metric = pMVar4;
      __cxa_guard_release(&StartEdge(Edge*,std::__cxx11::string*)::metrics_h_metric);
    }
  }
  ScopedMetric::ScopedMetric(&local_78,StartEdge::metrics_h_metric);
  bVar2 = Edge::is_phony(edge);
  bVar5 = true;
  if (!bVar2) {
    BuildStatus::BuildEdgeStarted(this->status_,edge);
    ppNVar6 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      if (ppNVar6 ==
          (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        Edge::GetUnescapedRspfile_abi_cxx11_(&sStack_d8,edge);
        if (sStack_d8._M_string_length == 0) {
LAB_0010b5af:
          pCVar1 = (this->command_runner_)._M_t.
                   super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                   super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                   super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
          iVar3 = (*pCVar1->_vptr_CommandRunner[3])(pCVar1,edge);
          bVar5 = true;
          if ((char)iVar3 == '\0') {
            Edge::EvaluateCommand_abi_cxx11_(&local_68,edge,false);
            std::operator+(&local_98,"command \'",&local_68);
            std::operator+(&local_b8,&local_98,"\' failed.");
            std::__cxx11::string::operator=((string *)err,(string *)&local_b8);
            std::__cxx11::string::~string((string *)&local_b8);
            std::__cxx11::string::~string((string *)&local_98);
            std::__cxx11::string::~string((string *)&local_68);
            goto LAB_0010b62d;
          }
        }
        else {
          this_00 = edge->env_;
          std::__cxx11::string::string((string *)&local_48,(string *)&sStack_d8);
          RelPathEnv::ApplyChdir(&local_b8,&this_00->super_RelPathEnv,&local_48);
          std::__cxx11::string::operator=((string *)&sStack_d8,(string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_48);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,"rspfile_content",(allocator<char> *)&local_68);
          Edge::GetBinding(&local_b8,edge,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          iVar3 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[7])
                            (this->disk_interface_,&sStack_d8,&local_b8);
          std::__cxx11::string::~string((string *)&local_b8);
          if ((char)iVar3 != '\0') goto LAB_0010b5af;
LAB_0010b62d:
          bVar5 = false;
        }
        std::__cxx11::string::~string((string *)&sStack_d8);
        goto LAB_0010b637;
      }
      bVar2 = DiskInterface::MakeDirs(this->disk_interface_,&(*ppNVar6)->env_path_);
      ppNVar6 = ppNVar6 + 1;
    } while (bVar2);
    bVar5 = false;
  }
LAB_0010b637:
  ScopedMetric::~ScopedMetric(&local_78);
  return bVar5;
}

Assistant:

bool Builder::StartEdge(Edge* edge, string* err) {
  METRIC_RECORD("StartEdge");
  if (edge->is_phony())
    return true;

  status_->BuildEdgeStarted(edge);

  // Create directories necessary for outputs.
  // XXX: this will block; do we care?
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (!disk_interface_->MakeDirs((*o)->path()))
      return false;
  }

  // Create response file, if needed
  // XXX: this may also block; do we care?
  // The rspfile will not have current chdir and must be fixed up.
  // But first detect whether rspfile was absent.
  string rspfile = edge->GetUnescapedRspfile();
  if (!rspfile.empty()) {
    // Apply chdir fixup.
    rspfile = edge->env_->ApplyChdir(rspfile);
    string content = edge->GetBinding("rspfile_content");
    if (!disk_interface_->WriteFile(rspfile, content))
      return false;
  }

  // start command computing and run it
  if (!command_runner_->StartCommand(edge)) {
    err->assign("command '" + edge->EvaluateCommand() + "' failed.");
    return false;
  }

  return true;
}